

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.h
# Opt level: O2

mp_int * mp__from_string_literal(char *lit)

{
  mp_int *pmVar1;
  ptrlen decimal;
  
  if ((*lit != '\0') && ((byte)(lit[1] | 0x20U) == 0x78)) {
    pmVar1 = mp_from_hex(lit + 2);
    return pmVar1;
  }
  decimal = ptrlen_from_asciz(lit);
  pmVar1 = mp_from_decimal_pl(decimal);
  return pmVar1;
}

Assistant:

static inline mp_int *mp__from_string_literal(const char *lit)
{
    /* Don't call this directly; it's not equipped to deal with
     * hostile data. Use only via the MP_LITERAL macro. */
    if (lit[0] && (lit[1] == 'x' || lit[1] == 'X'))
        return mp_from_hex(lit+2);
    else
        return mp_from_decimal(lit);
}